

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O3

void __thiscall btRaycastVehicle::updateVehicle(btRaycastVehicle *this,btScalar step)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  btRigidBody *pbVar12;
  btWheelInfo *pbVar13;
  uint wheelIndex;
  long lVar14;
  long lVar15;
  btScalar deltaTime;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  btVector3 relpos;
  btVector3 impulse;
  btVector3 local_50;
  btVector3 local_40;
  
  wheelIndex = 0;
  if (0 < (this->m_wheelInfo).m_size) {
    do {
      updateWheelTransform(this,wheelIndex,false);
      wheelIndex = wheelIndex + 1;
      iVar11 = (this->m_wheelInfo).m_size;
    } while ((int)wheelIndex < iVar11);
    wheelIndex = (uint)(0 < iVar11);
  }
  pbVar12 = this->m_chassisBody;
  fVar18 = (pbVar12->m_linearVelocity).m_floats[0];
  fVar1 = (pbVar12->m_linearVelocity).m_floats[1];
  fVar2 = (pbVar12->m_linearVelocity).m_floats[2];
  deltaTime = SQRT(fVar2 * fVar2 + fVar18 * fVar18 + fVar1 * fVar1) * 3.6;
  this->m_currentVehicleSpeedKmHour = deltaTime;
  iVar11 = this->m_indexForwardAxis;
  if ((&(pbVar12->super_btCollisionObject).m_worldTransform.m_origin)[-1].m_floats[iVar11] *
      (pbVar12->m_linearVelocity).m_floats[2] +
      (pbVar12->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[iVar11] *
      (pbVar12->m_linearVelocity).m_floats[0] +
      (&(pbVar12->super_btCollisionObject).m_worldTransform.m_origin)[-2].m_floats[iVar11] *
      (pbVar12->m_linearVelocity).m_floats[1] < 0.0) {
    deltaTime = -deltaTime;
    this->m_currentVehicleSpeedKmHour = deltaTime;
  }
  if ((char)wheelIndex != '\0') {
    lVar14 = 0;
    lVar15 = 0;
    do {
      deltaTime = rayCast(this,(btWheelInfo *)
                               ((long)(((this->m_wheelInfo).m_data)->m_raycastInfo).
                                      m_contactNormalWS.m_floats + lVar14));
      lVar15 = lVar15 + 1;
      lVar14 = lVar14 + 0x128;
    } while (lVar15 < (this->m_wheelInfo).m_size);
  }
  updateSuspension(this,deltaTime);
  if (0 < (this->m_wheelInfo).m_size) {
    lVar14 = 0;
    lVar15 = 0;
    do {
      pbVar13 = (this->m_wheelInfo).m_data;
      fVar18 = *(float *)((long)(&pbVar13->m_wheelAxleCS + 3) + lVar14 + 0xc);
      fVar1 = *(float *)((long)(&pbVar13->m_wheelAxleCS + 6) + lVar14);
      if (fVar1 <= fVar18) {
        fVar18 = fVar1;
      }
      uVar9 = *(undefined8 *)((long)(pbVar13->m_raycastInfo).m_contactNormalWS.m_floats + lVar14);
      local_40.m_floats[1] = fVar18 * (float)((ulong)uVar9 >> 0x20) * step;
      local_40.m_floats[0] = fVar18 * (float)uVar9 * step;
      local_40.m_floats[2] =
           *(float *)((long)(pbVar13->m_raycastInfo).m_contactNormalWS.m_floats + lVar14 + 8) *
           fVar18 * step;
      local_40.m_floats[3] = 0.0;
      pbVar12 = this->m_chassisBody;
      uVar9 = *(undefined8 *)((long)(pbVar13->m_raycastInfo).m_contactPointWS.m_floats + lVar14);
      uVar10 = *(undefined8 *)(pbVar12->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
      local_50.m_floats[1] = (float)((ulong)uVar9 >> 0x20) - (float)((ulong)uVar10 >> 0x20);
      local_50.m_floats[0] = (float)uVar9 - (float)uVar10;
      local_50.m_floats[2] =
           *(float *)((long)(pbVar13->m_raycastInfo).m_contactPointWS.m_floats + lVar14 + 8) -
           (pbVar12->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
      local_50.m_floats[3] = 0.0;
      btRigidBody::applyImpulse(pbVar12,&local_40,&local_50);
      lVar15 = lVar15 + 1;
      lVar14 = lVar14 + 0x128;
    } while (lVar15 < (this->m_wheelInfo).m_size);
  }
  (*(this->super_btActionInterface)._vptr_btActionInterface[5])();
  lVar14 = (long)(this->m_wheelInfo).m_size;
  if (0 < lVar14) {
    pbVar12 = this->m_chassisBody;
    pbVar13 = (this->m_wheelInfo).m_data;
    iVar11 = this->m_indexForwardAxis;
    lVar15 = 0;
    do {
      if (*(bool *)((long)(&(pbVar13->m_raycastInfo).m_wheelAxleWS + 1) + lVar15) == true) {
        fVar17 = *(float *)((long)(pbVar13->m_raycastInfo).m_hardPointWS.m_floats + lVar15 + 4) -
                 (pbVar12->super_btCollisionObject).m_worldTransform.m_origin.m_floats[1];
        fVar16 = *(float *)((long)(pbVar13->m_raycastInfo).m_hardPointWS.m_floats + lVar15) -
                 (pbVar12->super_btCollisionObject).m_worldTransform.m_origin.m_floats[0];
        fVar18 = (pbVar12->m_angularVelocity).m_floats[0];
        fVar1 = (pbVar12->m_angularVelocity).m_floats[1];
        fVar2 = (pbVar12->m_angularVelocity).m_floats[2];
        fVar19 = *(float *)((long)(pbVar13->m_raycastInfo).m_hardPointWS.m_floats + lVar15 + 8) -
                 (pbVar12->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
        fVar3 = (pbVar12->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[iVar11]
        ;
        fVar4 = (&(pbVar12->super_btCollisionObject).m_worldTransform.m_origin)[-2].m_floats[iVar11]
        ;
        fVar5 = (&(pbVar12->super_btCollisionObject).m_worldTransform.m_origin)[-1].m_floats[iVar11]
        ;
        fVar6 = *(float *)((long)(pbVar13->m_raycastInfo).m_contactNormalWS.m_floats + lVar15);
        fVar7 = *(float *)((long)(pbVar13->m_raycastInfo).m_contactNormalWS.m_floats + lVar15 + 4);
        fVar8 = *(float *)((long)(pbVar13->m_raycastInfo).m_contactNormalWS.m_floats + lVar15 + 8);
        fVar20 = fVar5 * fVar8 + fVar3 * fVar6 + fVar4 * fVar7;
        fVar18 = (((fVar5 - fVar20 * fVar8) *
                   ((fVar18 * fVar17 - fVar16 * fVar1) + (pbVar12->m_linearVelocity).m_floats[2]) +
                  (fVar4 - fVar7 * fVar20) *
                  ((fVar16 * fVar2 - fVar18 * fVar19) + (pbVar12->m_linearVelocity).m_floats[1]) +
                  (fVar3 - fVar6 * fVar20) *
                  ((fVar19 * fVar1 - fVar17 * fVar2) + (pbVar12->m_linearVelocity).m_floats[0])) *
                 step) / *(float *)((long)(&pbVar13->m_wheelAxleCS + 1) + lVar15 + 8);
      }
      else {
        fVar18 = *(float *)((long)(&pbVar13->m_wheelAxleCS + 3) + lVar15 + 4);
      }
      *(float *)((long)(&pbVar13->m_wheelAxleCS + 3) + lVar15) =
           *(float *)((long)(&pbVar13->m_wheelAxleCS + 3) + lVar15) + fVar18;
      *(float *)((long)(&pbVar13->m_wheelAxleCS + 3) + lVar15 + 4) = fVar18 * 0.99;
      lVar15 = lVar15 + 0x128;
    } while (lVar14 * 0x128 - lVar15 != 0);
  }
  return;
}

Assistant:

void btRaycastVehicle::updateVehicle( btScalar step )
{
	{
		for (int i=0;i<getNumWheels();i++)
		{
			updateWheelTransform(i,false);
		}
	}


	m_currentVehicleSpeedKmHour = btScalar(3.6) * getRigidBody()->getLinearVelocity().length();
	
	const btTransform& chassisTrans = getChassisWorldTransform();

	btVector3 forwardW (
		chassisTrans.getBasis()[0][m_indexForwardAxis],
		chassisTrans.getBasis()[1][m_indexForwardAxis],
		chassisTrans.getBasis()[2][m_indexForwardAxis]);

	if (forwardW.dot(getRigidBody()->getLinearVelocity()) < btScalar(0.))
	{
		m_currentVehicleSpeedKmHour *= btScalar(-1.);
	}

	//
	// simulate suspension
	//
	
	int i=0;
	for (i=0;i<m_wheelInfo.size();i++)
	{
		//btScalar depth; 
		//depth = 
		rayCast( m_wheelInfo[i]);
	}

	updateSuspension(step);

	
	for (i=0;i<m_wheelInfo.size();i++)
	{
		//apply suspension force
		btWheelInfo& wheel = m_wheelInfo[i];
		
		btScalar suspensionForce = wheel.m_wheelsSuspensionForce;
		
		if (suspensionForce > wheel.m_maxSuspensionForce)
		{
			suspensionForce = wheel.m_maxSuspensionForce;
		}
		btVector3 impulse = wheel.m_raycastInfo.m_contactNormalWS * suspensionForce * step;
		btVector3 relpos = wheel.m_raycastInfo.m_contactPointWS - getRigidBody()->getCenterOfMassPosition();
		
		getRigidBody()->applyImpulse(impulse, relpos);
	
	}
	

	
	updateFriction( step);

	
	for (i=0;i<m_wheelInfo.size();i++)
	{
		btWheelInfo& wheel = m_wheelInfo[i];
		btVector3 relpos = wheel.m_raycastInfo.m_hardPointWS - getRigidBody()->getCenterOfMassPosition();
		btVector3 vel = getRigidBody()->getVelocityInLocalPoint( relpos );

		if (wheel.m_raycastInfo.m_isInContact)
		{
			const btTransform&	chassisWorldTransform = getChassisWorldTransform();

			btVector3 fwd (
				chassisWorldTransform.getBasis()[0][m_indexForwardAxis],
				chassisWorldTransform.getBasis()[1][m_indexForwardAxis],
				chassisWorldTransform.getBasis()[2][m_indexForwardAxis]);

			btScalar proj = fwd.dot(wheel.m_raycastInfo.m_contactNormalWS);
			fwd -= wheel.m_raycastInfo.m_contactNormalWS * proj;

			btScalar proj2 = fwd.dot(vel);
			
			wheel.m_deltaRotation = (proj2 * step) / (wheel.m_wheelsRadius);
			wheel.m_rotation += wheel.m_deltaRotation;

		} else
		{
			wheel.m_rotation += wheel.m_deltaRotation;
		}
		
		wheel.m_deltaRotation *= btScalar(0.99);//damping of rotation when not in contact

	}



}